

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quality_estimate.c
# Opt level: O2

int VP8EstimateQuality(uint8_t *data,size_t size)

{
  VP8StatusCode VVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  bool bVar10;
  double dVar11;
  uint64_t bit_pos;
  uint32_t local_74;
  uint local_70;
  uint32_t local_6c;
  int q [4];
  WebPBitstreamFeatures features;
  
  iVar6 = -1;
  if ((data != (uint8_t *)0x0) &&
     (VVar1 = WebPGetFeaturesInternal(data,size,&features,0x210), VVar1 == VP8_STATUS_OK)) {
    if (features.format == 2) {
      iVar6 = 0x65;
    }
    else if ((features.format != 0) && (features.has_animation == 0)) {
      bit_pos = 0x20;
      uVar5 = 4;
      uVar8 = 0;
      do {
        if (uVar5 - size == 4) {
          return -1;
        }
        uVar7 = uVar8 >> 8;
        lVar9 = uVar5 - 4;
        uVar8 = uVar7 | (ulong)data[lVar9] << 0x28;
        bit_pos = bit_pos + 8;
        uVar5 = uVar5 + 1;
      } while ((uVar7 & 0xffffffffff000000 | (ulong)data[lVar9] << 0x28) != 0x2a019d000000);
      if (uVar5 <= size) {
        GetBit(data,2,size,&bit_pos);
        uVar2 = GetBit(data,1,size,&bit_pos);
        if (uVar2 == 0) {
          local_74 = 0xffffffff;
        }
        else {
          uVar2 = GetBit(data,1,size,&bit_pos);
          uVar3 = GetBit(data,1,size,&bit_pos);
          if (uVar3 == 0) {
            local_74 = 0xffffffff;
          }
          else {
            local_6c = uVar2;
            local_74 = GetBit(data,1,size,&bit_pos);
            q[0] = 0;
            q[1] = 0;
            q[2] = 0;
            q[3] = 0;
            for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
              uVar2 = GetBit(data,1,size,&bit_pos);
              if (uVar2 != 0) {
                uVar2 = GetBit(data,7,size,&bit_pos);
                q[lVar9] = uVar2;
                uVar3 = GetBit(data,1,size,&bit_pos);
                if (uVar3 != 0) {
                  q[lVar9] = -uVar2;
                }
              }
            }
            iVar6 = 4;
            local_70 = q[0];
            while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
              uVar2 = GetBit(data,1,size,&bit_pos);
              if (uVar2 != 0) {
                GetBit(data,7,size,&bit_pos);
              }
            }
            local_74 = -(uint)(local_74 == 0) | local_70;
            uVar2 = local_6c;
          }
          if (uVar2 != 0) {
            iVar6 = 3;
            while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
              uVar2 = GetBit(data,1,size,&bit_pos);
              if (uVar2 != 0) {
                GetBit(data,8,size,&bit_pos);
              }
            }
          }
        }
        GetBit(data,10,size,&bit_pos);
        uVar2 = GetBit(data,1,size,&bit_pos);
        if ((uVar2 != 0) && (uVar2 = GetBit(data,1,size,&bit_pos), uVar2 != 0)) {
          iVar6 = 8;
          while (bVar10 = iVar6 != 0, iVar6 = iVar6 + -1, bVar10) {
            uVar2 = GetBit(data,1,size,&bit_pos);
            if (uVar2 != 0) {
              GetBit(data,6,size,&bit_pos);
            }
          }
        }
        GetBit(data,2,size,&bit_pos);
        uVar4 = GetBit(data,7,size,&bit_pos);
        uVar2 = GetBit(data,1,size,&bit_pos);
        if (uVar2 != 0) {
          GetBit(data,5,size,&bit_pos);
        }
        uVar2 = GetBit(data,1,size,&bit_pos);
        if (uVar2 != 0) {
          GetBit(data,5,size,&bit_pos);
        }
        uVar2 = GetBit(data,1,size,&bit_pos);
        if (uVar2 != 0) {
          GetBit(data,5,size,&bit_pos);
        }
        uVar2 = GetBit(data,1,size,&bit_pos);
        if (uVar2 != 0) {
          GetBit(data,5,size,&bit_pos);
        }
        uVar2 = GetBit(data,1,size,&bit_pos);
        if (uVar2 != 0) {
          GetBit(data,5,size,&bit_pos);
        }
        if (-1 < (int)local_74) {
          uVar4 = local_74;
        }
        iVar6 = (int)((0x7f - uVar4) * 100) / 0x7f;
        if (0x19 < (int)uVar4) {
          dVar11 = pow((double)iVar6 / 80.0,2.6315789473684212);
          iVar6 = (int)(dVar11 * 80.0);
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int VP8EstimateQuality(const uint8_t* const data, size_t size) {
  size_t pos = 0;
  uint64_t bit_pos;
  uint64_t sig = 0x00;
  int ok = 0;
  int Q = -1;
  WebPBitstreamFeatures features;

  if (data == NULL) return -1;

  if (WebPGetFeatures(data, size, &features) != VP8_STATUS_OK) {
    return -1;   // invalid file
  }
  if (features.format == 2) return 101;  // lossless
  if (features.format == 0 || features.has_animation) return -1;   // mixed

  while (pos < size) {
    sig = (sig >> 8) | ((uint64_t)data[pos++] << 40);
    if ((sig >> 24) == 0x2a019dull) {
      ok = 1;
      break;
    }
  }
  if (!ok) return -1;
  if (pos + 4 > size) return -1;

  // Skip main Header
  // width  = (data[pos + 0] | (data[pos + 1] << 8)) & 0x3fff;
  // height = (data[pos + 2] | (data[pos + 3] << 8)) & 0x3fff;
  pos += 4;
  bit_pos = pos * 8;

  GET_BIT(2);  // colorspace + clamp type

  // Segment header
  if (GET_BIT(1)) {       // use_segment
    int s;
    const int update_map = GET_BIT(1);
    if (GET_BIT(1)) {     // update data
      const int absolute_delta = GET_BIT(1);
      int q[4]  = { 0, 0, 0, 0 };
      for (s = 0; s < 4; ++s) {
        if (GET_BIT(1)) {
          q[s] = GET_BIT(7);
          if (GET_BIT(1)) q[s] = -q[s];   // sign
        }
      }
      if (absolute_delta) Q = q[0];  // just use the first segment's quantizer
      for (s = 0; s < 4; ++s) CONDITIONAL_SKIP(7);   //  filter strength
    }
    if (update_map) {
      for (s = 0; s < 3; ++s) CONDITIONAL_SKIP(8);
    }
  }
  // Filter header
  GET_BIT(1 + 6 + 3);     // simple + level + sharpness
  if (GET_BIT(1)) {       // use_lf_delta
    if (GET_BIT(1)) {     // update lf_delta?
      int n;
      for (n = 0; n < 4 + 4; ++n) CONDITIONAL_SKIP(6);
    }
  }
  // num partitions
  GET_BIT(2);

  // ParseQuant
  {
    const int base_q = GET_BIT(7);
    /* dqy1_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_dc = */ CONDITIONAL_SKIP(5);
    /* dqy2_ac = */ CONDITIONAL_SKIP(5);
    /* dquv_dc = */ CONDITIONAL_SKIP(5);
    /* dquv_ac = */ CONDITIONAL_SKIP(5);

    if (Q < 0) Q = base_q;
  }
  if (bit_pos == INVALID_BIT_POS) return -1;

  // base mapping
  Q = (127 - Q) * 100 / 127;
  // correction for power-law behavior in low range
  if (Q < 80) {
    Q = (int)(pow(Q / 80., 1. / 0.38) * 80);
  }
  return Q;
}